

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGIncludePush(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGIncludePtr_conflict value)

{
  int iVar1;
  xmlRelaxNGIncludePtr_conflict *ppxVar2;
  xmlRelaxNGIncludePtr_conflict value_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  if (ctxt->incTab == (xmlRelaxNGIncludePtr_conflict *)0x0) {
    ctxt->incMax = 4;
    ctxt->incNr = 0;
    ppxVar2 = (xmlRelaxNGIncludePtr_conflict *)(*xmlMalloc)((long)ctxt->incMax << 3);
    ctxt->incTab = ppxVar2;
    if (ctxt->incTab == (xmlRelaxNGIncludePtr_conflict *)0x0) {
      xmlRngPErrMemory(ctxt,"allocating include\n");
      return 0;
    }
  }
  if (ctxt->incMax <= ctxt->incNr) {
    ctxt->incMax = ctxt->incMax << 1;
    ppxVar2 = (xmlRelaxNGIncludePtr_conflict *)(*xmlRealloc)(ctxt->incTab,(long)ctxt->incMax << 3);
    ctxt->incTab = ppxVar2;
    if (ctxt->incTab == (xmlRelaxNGIncludePtr_conflict *)0x0) {
      xmlRngPErrMemory(ctxt,"allocating include\n");
      return 0;
    }
  }
  ctxt->incTab[ctxt->incNr] = value;
  ctxt->inc = value;
  iVar1 = ctxt->incNr;
  ctxt->incNr = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
xmlRelaxNGIncludePush(xmlRelaxNGParserCtxtPtr ctxt,
                      xmlRelaxNGIncludePtr value)
{
    if (ctxt->incTab == NULL) {
        ctxt->incMax = 4;
        ctxt->incNr = 0;
        ctxt->incTab =
            (xmlRelaxNGIncludePtr *) xmlMalloc(ctxt->incMax *
                                               sizeof(ctxt->incTab[0]));
        if (ctxt->incTab == NULL) {
            xmlRngPErrMemory(ctxt, "allocating include\n");
            return (0);
        }
    }
    if (ctxt->incNr >= ctxt->incMax) {
        ctxt->incMax *= 2;
        ctxt->incTab =
            (xmlRelaxNGIncludePtr *) xmlRealloc(ctxt->incTab,
                                                ctxt->incMax *
                                                sizeof(ctxt->incTab[0]));
        if (ctxt->incTab == NULL) {
            xmlRngPErrMemory(ctxt, "allocating include\n");
            return (0);
        }
    }
    ctxt->incTab[ctxt->incNr] = value;
    ctxt->inc = value;
    return (ctxt->incNr++);
}